

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *
Catch::anon_unknown_26::readBazelShardingOptions(void)

{
  bool bVar1;
  char *__s;
  char *__s_00;
  char *__s_01;
  ostream *poVar2;
  uint *puVar3;
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *in_RDI;
  bool local_da;
  allocator<char> local_d9;
  bazelShardingOptions local_d8;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  Optional<unsigned_int> shardTotal;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  Optional<unsigned_int> shardIndex;
  anon_class_1_0_00000001 warn;
  bool has_all;
  char *bazelShardInfoFile;
  char *bazelShardTotal;
  char *bazelShardIndex;
  
  __s = Detail::getEnv("TEST_SHARD_INDEX");
  __s_00 = Detail::getEnv("TEST_TOTAL_SHARDS");
  __s_01 = Detail::getEnv("TEST_SHARD_STATUS_FILE");
  local_da = false;
  if ((__s != (char *)0x0) && (local_da = false, __s_00 != (char *)0x0)) {
    local_da = __s_01 != (char *)0x0;
  }
  shardIndex._15_1_ = local_da;
  if (local_da == false) {
    if (__s == (char *)0x0) {
      readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&shardIndex.field_0xe,"TEST_SHARD_INDEX");
    }
    if (__s_00 == (char *)0x0) {
      readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&shardIndex.field_0xe,"TEST_TOTAL_SHARDS");
    }
    if (__s_01 == (char *)0x0) {
      readBazelShardingOptions::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&shardIndex.field_0xe,"TEST_SHARD_STATUS_FILE");
    }
    Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::Optional(in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    parseUInt((Catch *)local_40,&local_60,10);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    bVar1 = Optional<unsigned_int>::operator!((Optional<unsigned_int> *)local_40);
    if (bVar1) {
      poVar2 = cerr();
      poVar2 = std::operator<<(poVar2,"Warning: could not parse \'TEST_SHARD_INDEX\' (\'");
      poVar2 = std::operator<<(poVar2,__s);
      std::operator<<(poVar2,"\') as unsigned int.\n");
      Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::Optional(in_RDI);
      shardTotal.storage[0] = '\x01';
      shardTotal.storage[1] = '\0';
      shardTotal.storage[2] = '\0';
      shardTotal.storage[3] = '\0';
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s_00,&local_a9);
      parseUInt((Catch *)local_88,&local_a8,10);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      bVar1 = Optional<unsigned_int>::operator!((Optional<unsigned_int> *)local_88);
      if (bVar1) {
        poVar2 = cerr();
        poVar2 = std::operator<<(poVar2,"Warning: could not parse \'TEST_TOTAL_SHARD\' (\'");
        poVar2 = std::operator<<(poVar2,__s_00);
        std::operator<<(poVar2,"\') as unsigned int.\n");
        Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::Optional(in_RDI);
      }
      else {
        puVar3 = Optional<unsigned_int>::operator*((Optional<unsigned_int> *)local_40);
        local_d8.shardIndex = *puVar3;
        puVar3 = Optional<unsigned_int>::operator*((Optional<unsigned_int> *)local_88);
        local_d8.shardCount = *puVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8.shardFilePath,__s_01,&local_d9);
        Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::Optional(in_RDI,&local_d8);
        bazelShardingOptions::~bazelShardingOptions(&local_d8);
        std::allocator<char>::~allocator(&local_d9);
      }
      shardTotal.storage[0] = '\x01';
      shardTotal.storage[1] = '\0';
      shardTotal.storage[2] = '\0';
      shardTotal.storage[3] = '\0';
      Optional<unsigned_int>::~Optional((Optional<unsigned_int> *)local_88);
    }
    Optional<unsigned_int>::~Optional((Optional<unsigned_int> *)local_40);
  }
  return in_RDI;
}

Assistant:

static Optional<bazelShardingOptions> readBazelShardingOptions() {
            const auto bazelShardIndex = Detail::getEnv( "TEST_SHARD_INDEX" );
            const auto bazelShardTotal = Detail::getEnv( "TEST_TOTAL_SHARDS" );
            const auto bazelShardInfoFile = Detail::getEnv( "TEST_SHARD_STATUS_FILE" );


            const bool has_all =
                bazelShardIndex && bazelShardTotal && bazelShardInfoFile;
            if ( !has_all ) {
                // We provide nice warning message if the input is
                // misconfigured.
                auto warn = []( const char* env_var ) {
                    Catch::cerr()
                        << "Warning: Bazel shard configuration is missing '"
                        << env_var << "'. Shard configuration is skipped.\n";
                };
                if ( !bazelShardIndex ) {
                    warn( "TEST_SHARD_INDEX" );
                }
                if ( !bazelShardTotal ) {
                    warn( "TEST_TOTAL_SHARDS" );
                }
                if ( !bazelShardInfoFile ) {
                    warn( "TEST_SHARD_STATUS_FILE" );
                }
                return {};
            }

            auto shardIndex = parseUInt( bazelShardIndex );
            if ( !shardIndex ) {
                Catch::cerr()
                    << "Warning: could not parse 'TEST_SHARD_INDEX' ('" << bazelShardIndex
                    << "') as unsigned int.\n";
                return {};
            }
            auto shardTotal = parseUInt( bazelShardTotal );
            if ( !shardTotal ) {
                Catch::cerr()
                    << "Warning: could not parse 'TEST_TOTAL_SHARD' ('"
                    << bazelShardTotal << "') as unsigned int.\n";
                return {};
            }

            return bazelShardingOptions{
                *shardIndex, *shardTotal, bazelShardInfoFile };

        }